

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall QGridLayout::setGeometry(QGridLayout *this,QRect *rect)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  long lVar1;
  undefined1 auVar2 [16];
  QRect r;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if ((this_00->field_0x194 & 4) == 0) {
    auVar2 = (**(code **)(*(long *)&this->super_QLayout + 0x78))(this);
    if (((((rect->x1).m_i == auVar2._0_4_) && ((rect->x2).m_i == auVar2._8_4_)) &&
        ((rect->y1).m_i == auVar2._4_4_)) && ((rect->y2).m_i == auVar2._12_4_)) {
      return;
    }
  }
  if ((this->super_QLayout).super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i == 0) {
    r = *rect;
  }
  else {
    r = QLayout::alignmentRect(&this->super_QLayout,rect);
  }
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  hSpacing = *(int *)(lVar1 + 0x17c);
  if (hSpacing < 0) {
    hSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutHorizontalSpacing);
    lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  }
  vSpacing = *(int *)(lVar1 + 0x180);
  if (vSpacing < 0) {
    vSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutVerticalSpacing);
  }
  QGridLayoutPrivate::distribute(this_00,r,hSpacing,vSpacing);
  QLayout::setGeometry(&this->super_QLayout,rect);
  return;
}

Assistant:

void QGridLayout::setGeometry(const QRect &rect)
{
    Q_D(QGridLayout);
    if (d->isDirty() || rect != geometry()) {
        QRect cr = alignment() ? alignmentRect(rect) : rect;
        d->distribute(cr, horizontalSpacing(), verticalSpacing());
        QLayout::setGeometry(rect);
    }
}